

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::create_alpha_selector_codebook(dxt_hc *this)

{
  bool bVar1;
  unsigned_long_long uVar2;
  task_pool *ptVar3;
  undefined4 uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  float fVar10;
  unsigned_long_long *puVar11;
  SelectorNode *pSVar12;
  size_type sVar13;
  const_reference pvVar14;
  float *pfVar15;
  uint *puVar16;
  vec<16U,_float> *pvVar17;
  ulong uVar18;
  vector<crnlib::alpha_selector_details> *pvVar19;
  alpha_selector_details *paVar20;
  bool *pbVar21;
  uint (*pauVar22) [8];
  float fVar23;
  byte local_463;
  byte local_462;
  byte local_461;
  byte local_3f1;
  uint local_274;
  uint8 s36;
  uint8 s02;
  uint8 s56;
  uint8 s34;
  uint8 s12;
  uint8 s07;
  uint *e;
  uint p_2;
  uint sh_1;
  uint (*errors) [16] [8];
  uint i_6;
  uint8 s_1;
  uint uStack_234;
  uint8 p_1;
  uint i_5;
  uint t_1;
  uint local_21c;
  undefined1 local_218 [4];
  uint t;
  vector<crnlib::vector<crnlib::alpha_selector_details>_> selector_details;
  uint j;
  uint sh;
  vec16F *v_1;
  undefined1 local_1f0 [4];
  uint i_4;
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  uint p;
  vec16F vector;
  uint weight;
  uint64 selector;
  SelectorNode node_1;
  uint64 prev_selector;
  vector<unsigned_int> weights;
  vector<crnlib::vec<16U,_float>_> vectors;
  float fStack_b8;
  uint s;
  float v [8];
  undefined1 local_90 [4];
  uint i_3;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  uint i_2;
  uint i_1;
  SelectorNode node;
  vector<crnlib::SelectorNode> nodes;
  uint local_34;
  uint step;
  uint b;
  uint c;
  uint i;
  vector<unsigned_long_long> selectors;
  uint num_tasks;
  dxt_hc *this_local;
  
  uVar8 = task_pool::get_num_threads(this->m_pTask_pool);
  selectors.m_capacity = uVar8 + 1;
  if ((this->m_has_subblocks & 1U) == 0) {
    local_274 = this->m_num_blocks;
  }
  else {
    local_274 = this->m_num_blocks >> 1;
  }
  vector<unsigned_long_long>::vector
            ((vector<unsigned_long_long> *)&c,this->m_num_alpha_blocks * local_274);
  b = 0;
  for (step = 1; step < this->m_num_alpha_blocks + 1; step = step + 1) {
    local_34 = 0;
    iVar9 = 1;
    if ((this->m_has_subblocks & 1U) != 0) {
      iVar9 = 2;
    }
    for (; local_34 < this->m_num_blocks; local_34 = iVar9 + local_34) {
      puVar11 = vector<unsigned_long_long>::operator[](this->m_block_selectors + step,local_34);
      uVar2 = *puVar11;
      puVar11 = vector<unsigned_long_long>::operator[]((vector<unsigned_long_long> *)&c,b);
      *puVar11 = uVar2;
      b = b + 1;
    }
  }
  vector<crnlib::SelectorNode>::vector((vector<crnlib::SelectorNode> *)&node.pEnd);
  puVar11 = vector<unsigned_long_long>::get_ptr((vector<unsigned_long_long> *)&c);
  SelectorNode::SelectorNode((SelectorNode *)&i_2,(uint64 *)0x0,puVar11);
  for (queue._28_4_ = 0; (uint)queue._28_4_ < selectors.m_capacity; queue._28_4_ = queue._28_4_ + 1)
  {
    _i_2 = node.p;
    puVar11 = vector<unsigned_long_long>::get_ptr((vector<unsigned_long_long> *)&c);
    uVar8 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&c);
    node.p = puVar11 + (ulong)(uVar8 * (queue._28_4_ + 1)) / (ulong)selectors.m_capacity;
    if (_i_2 != node.p) {
      vector<crnlib::SelectorNode>::push_back
                ((vector<crnlib::SelectorNode> *)&node.pEnd,(SelectorNode *)&i_2);
    }
  }
  for (queue._24_4_ = 0; uVar4 = queue._24_4_,
      uVar8 = vector<crnlib::SelectorNode>::size((vector<crnlib::SelectorNode> *)&node.pEnd),
      (uint)uVar4 < uVar8; queue._24_4_ = queue._24_4_ + 1) {
    ptVar3 = this->m_pTask_pool;
    uVar18 = (ulong)(uint)queue._24_4_;
    pSVar12 = vector<crnlib::SelectorNode>::operator[]
                        ((vector<crnlib::SelectorNode> *)&node.pEnd,queue._24_4_);
    task_pool::queue_task(ptVar3,SelectorNode::sort_task,uVar18,pSVar12);
  }
  task_pool::join(this->m_pTask_pool);
  std::
  priority_queue<crnlib::SelectorNode,std::vector<crnlib::SelectorNode,std::allocator<crnlib::SelectorNode>>,std::less<crnlib::SelectorNode>>
  ::priority_queue<std::vector<crnlib::SelectorNode,std::allocator<crnlib::SelectorNode>>,void>
            ((priority_queue<crnlib::SelectorNode,std::vector<crnlib::SelectorNode,std::allocator<crnlib::SelectorNode>>,std::less<crnlib::SelectorNode>>
              *)local_90);
  for (v[7] = 0.0; fVar23 = v[7],
      fVar10 = (float)vector<crnlib::SelectorNode>::size((vector<crnlib::SelectorNode> *)&node.pEnd)
      , (uint)fVar23 < (uint)fVar10; v[7] = (float)((int)v[7] + 1)) {
    pSVar12 = vector<crnlib::SelectorNode>::operator[]
                        ((vector<crnlib::SelectorNode> *)&node.pEnd,(uint)v[7]);
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::push((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
            *)local_90,pSVar12);
  }
  for (vectors.m_capacity = 0; vectors.m_capacity < 8; vectors.m_capacity = vectors.m_capacity + 1)
  {
    (&fStack_b8)[vectors.m_capacity] = ((float)vectors.m_capacity + 0.5) * 0.125;
  }
  vector<crnlib::vec<16U,_float>_>::vector((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  vector<unsigned_int>::vector((vector<unsigned_int> *)&prev_selector);
  uVar8 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&c);
  vector<crnlib::vec<16U,_float>_>::reserve
            ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size,uVar8);
  uVar8 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)&c);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)&prev_selector,uVar8);
  node_1.pEnd = (uint64 *)0x0;
  while (sVar13 = std::
                  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                  ::size((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                          *)local_90), sVar13 != 0) {
    pvVar14 = std::
              priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
              ::top((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                     *)local_90);
    node_1.p = pvVar14->pEnd;
    selector = (uint64)(pvVar14->p + 1);
    unique0x00012000 = (uint64 *)*pvVar14->p;
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::pop((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
           *)local_90);
    if ((uint64 *)selector != node_1.p) {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
              *)local_90,(value_type *)&selector);
    }
    vector.m_s[0xe] = (float)(uint)vector.m_s[0xf]._0_2_;
    register0x00000000 = (uint64 *)((ulong)stack0xffffffffffffff00 >> 0x10);
    uVar8 = vector<crnlib::vec<16U,_float>_>::size
                      ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
    if ((uVar8 == 0) || (stack0xffffffffffffff00 != node_1.pEnd)) {
      node_1.pEnd = stack0xffffffffffffff00;
      vec<16U,_float>::vec((vec<16U,_float> *)&selector_vq.m_codebook.m_capacity);
      for (selector_vq.m_codebook.m_size = 0; selector_vq.m_codebook.m_size < 0x10;
          selector_vq.m_codebook.m_size = selector_vq.m_codebook.m_size + 1) {
        fVar23 = (&fStack_b8)[(uint)vector.m_s[0xf] & 7];
        pfVar15 = vec<16U,_float>::operator[]
                            ((vec<16U,_float> *)&selector_vq.m_codebook.m_capacity,
                             0xf - selector_vq.m_codebook.m_size);
        *pfVar15 = fVar23;
        register0x00000000 = (uint64 *)((ulong)stack0xffffffffffffff00 >> 3);
      }
      vector<crnlib::vec<16U,_float>_>::push_back
                ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size,
                 (vec<16U,_float> *)&selector_vq.m_codebook.m_capacity);
      vector<unsigned_int>::push_back
                ((vector<unsigned_int> *)&prev_selector,(uint *)(vector.m_s + 0xe));
    }
    else {
      puVar16 = vector<unsigned_int>::back((vector<unsigned_int> *)&prev_selector);
      fVar23 = vector.m_s[0xe];
      if (-(int)vector.m_s[0xe] - 1U < *puVar16) {
        puVar16 = vector<unsigned_int>::back((vector<unsigned_int> *)&prev_selector);
        *puVar16 = 0xffffffff;
      }
      else {
        puVar16 = vector<unsigned_int>::back((vector<unsigned_int> *)&prev_selector);
        *puVar16 = (int)fVar23 + *puVar16;
      }
    }
  }
  tree_clusterizer<crnlib::vec<16U,_float>_>::tree_clusterizer
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0);
  pvVar17 = vector<crnlib::vec<16U,_float>_>::get_ptr
                      ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  puVar16 = vector<unsigned_int>::get_ptr((vector<unsigned_int> *)&prev_selector);
  uVar8 = vector<crnlib::vec<16U,_float>_>::size
                    ((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0,pvVar17,puVar16,uVar8,
             (this->m_params).m_alpha_selector_codebook_size,false,this->m_pTask_pool);
  uVar8 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                    ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0);
  vector<unsigned_long_long>::resize(&this->m_alpha_selectors,uVar8,false);
  uVar8 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                    ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0);
  vector<bool>::resize(&this->m_alpha_selectors_used,uVar8,false);
  for (v_1._4_4_ = 0;
      uVar8 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                        ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0), v_1._4_4_ < uVar8
      ; v_1._4_4_ = v_1._4_4_ + 1) {
    pvVar17 = tree_clusterizer<crnlib::vec<16U,_float>_>::get_codebook_entry
                        ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0,v_1._4_4_);
    puVar11 = vector<unsigned_long_long>::operator[](&this->m_alpha_selectors,v_1._4_4_);
    *puVar11 = 0;
    selector_details.m_capacity = 0;
    for (selector_details.m_size = 0; selector_details.m_size < 0x10;
        selector_details.m_size = selector_details.m_size + 1) {
      fVar23 = vec<16U,_float>::operator[](pvVar17,selector_details.m_size);
      uVar18 = (ulong)(fVar23 * 8.0);
      bVar7 = (byte)selector_details.m_capacity & 0x3f;
      puVar11 = vector<unsigned_long_long>::operator[](&this->m_alpha_selectors,v_1._4_4_);
      *puVar11 = (uVar18 | (long)(fVar23 * 8.0 - 9.223372e+18) & (long)uVar18 >> 0x3f) << bVar7 |
                 *puVar11;
      selector_details.m_capacity = selector_details.m_capacity + 3;
    }
  }
  vector<crnlib::vector<crnlib::alpha_selector_details>_>::vector
            ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,
             selectors.m_capacity);
  for (local_21c = 0; local_21c < selectors.m_capacity; local_21c = local_21c + 1) {
    pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                        ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,
                         local_21c);
    uVar8 = vector<unsigned_long_long>::size(&this->m_alpha_selectors);
    vector<crnlib::alpha_selector_details>::resize(pvVar19,uVar8,false);
    ptVar3 = this->m_pTask_pool;
    vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
              ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,local_21c);
    task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
              (ptVar3,this,0x1ccb50,0,(void *)(ulong)local_21c);
  }
  task_pool::join(this->m_pTask_pool);
  for (uStack_234 = 1; uStack_234 < selectors.m_capacity; uStack_234 = uStack_234 + 1) {
    for (i_6 = 0; uVar8 = vector<unsigned_long_long>::size(&this->m_alpha_selectors), i_6 < uVar8;
        i_6 = i_6 + 1) {
      for (errors._7_1_ = 0; errors._7_1_ < 0x10; errors._7_1_ = errors._7_1_ + 1) {
        for (errors._6_1_ = 0; errors._6_1_ < 8; errors._6_1_ = errors._6_1_ + 1) {
          pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                              ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,
                               uStack_234);
          paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,i_6);
          uVar8 = paVar20->error[errors._7_1_][errors._6_1_];
          pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                              ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,
                               0);
          paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,i_6);
          paVar20->error[errors._7_1_][errors._6_1_] =
               uVar8 + paVar20->error[errors._7_1_][errors._6_1_];
        }
      }
      pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                          ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,0);
      paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,i_6);
      local_3f1 = 1;
      if ((paVar20->used & 1U) == 0) {
        pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                            ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,
                             uStack_234);
        paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,i_6);
        local_3f1 = paVar20->used;
      }
      pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                          ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,0);
      paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,i_6);
      paVar20->used = (bool)(local_3f1 & 1);
    }
  }
  for (errors._0_4_ = 0; uVar8 = vector<unsigned_long_long>::size(&this->m_alpha_selectors),
      (uint)errors < uVar8; errors._0_4_ = (uint)errors + 1) {
    pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                        ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,0);
    paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,(uint)errors);
    bVar1 = paVar20->used;
    pbVar21 = vector<bool>::operator[](&this->m_alpha_selectors_used,(uint)errors);
    *pbVar21 = (bool)(bVar1 & 1);
    pvVar19 = vector<crnlib::vector<crnlib::alpha_selector_details>_>::operator[]
                        ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218,0);
    paVar20 = vector<crnlib::alpha_selector_details>::operator[](pvVar19,(uint)errors);
    puVar11 = vector<unsigned_long_long>::operator[](&this->m_alpha_selectors,(uint)errors);
    *puVar11 = 0;
    bVar7 = 0;
    for (e._0_4_ = 0; (uint)e < 0x10; e._0_4_ = (uint)e + 1) {
      pauVar22 = paVar20->error + (uint)e;
      local_461 = 0;
      if ((*pauVar22)[7] < (*pauVar22)[0]) {
        local_461 = 7;
      }
      bVar5 = 1;
      if ((*pauVar22)[2] < (*pauVar22)[1]) {
        bVar5 = 2;
      }
      local_462 = 3;
      if ((*pauVar22)[4] < (*pauVar22)[3]) {
        local_462 = 4;
      }
      bVar6 = 5;
      if ((*pauVar22)[6] < (*pauVar22)[5]) {
        bVar6 = 6;
      }
      if ((*pauVar22)[bVar5] < (*pauVar22)[local_461]) {
        local_461 = bVar5;
      }
      if ((*pauVar22)[bVar6] < (*pauVar22)[local_462]) {
        local_462 = bVar6;
      }
      if ((*pauVar22)[local_462] < (*pauVar22)[local_461]) {
        local_463 = local_462;
      }
      else {
        local_463 = local_461;
      }
      puVar11 = vector<unsigned_long_long>::operator[](&this->m_alpha_selectors,(uint)errors);
      *puVar11 = (ulong)local_463 << (bVar7 & 0x3f) | *puVar11;
      bVar7 = bVar7 + 3;
    }
  }
  vector<crnlib::vector<crnlib::alpha_selector_details>_>::~vector
            ((vector<crnlib::vector<crnlib::alpha_selector_details>_> *)local_218);
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer
            ((tree_clusterizer<crnlib::vec<16U,_float>_> *)local_1f0);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)&prev_selector);
  vector<crnlib::vec<16U,_float>_>::~vector((vector<crnlib::vec<16U,_float>_> *)&weights.m_size);
  std::
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  ::~priority_queue((priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
                     *)local_90);
  vector<crnlib::SelectorNode>::~vector((vector<crnlib::SelectorNode> *)&node.pEnd);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)&c);
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<uint64> selectors(m_num_alpha_blocks * (m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks));
  for (uint i = 0, c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
    for (uint b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
      selectors[i++] = m_block_selectors[c][b];
  }

  crnlib::vector<SelectorNode> nodes;
  SelectorNode node(0, selectors.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<SelectorNode> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  float v[8];
  for (uint s = 0; s < 8; s++)
    v[s] = (s + 0.5f) * 0.125f;

  crnlib::vector<vec16F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(selectors.size());
  weights.reserve(selectors.size());
  for (uint64 prev_selector = 0; queue.size();) {
    SelectorNode node = queue.top();
    uint64 selector = *node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    uint weight = (uint16)selector;
    selector >>= 16;
    if (!vectors.size() || selector != prev_selector) {
      prev_selector = selector;
      vec16F vector;
      for (uint p = 0; p < 16; p++, selector >>= 3)
        vector[15 - p] = v[selector & 7];
      vectors.push_back(vector);
      weights.push_back(weight);
    } else if (weights.back() > UINT_MAX - weight) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += weight;
    }
  }

  tree_clusterizer<vec16F> selector_vq;
  selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_alpha_selector_codebook_size, false, m_pTask_pool);
  m_alpha_selectors.resize(selector_vq.get_codebook_size());
  m_alpha_selectors_used.resize(selector_vq.get_codebook_size());
  for (uint i = 0; i < selector_vq.get_codebook_size(); i++) {
    const vec16F& v = selector_vq.get_codebook_entry(i);
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, j = 0; j < 16; j++, sh += 3)
      m_alpha_selectors[i] |= (uint64)(v[j] * 8.0f) << sh;
  }

  crnlib::vector<crnlib::vector<alpha_selector_details> > selector_details(num_tasks);
  for (uint t = 0; t < num_tasks; t++) {
    selector_details[t].resize(m_alpha_selectors.size());
    m_pTask_pool->queue_object_task(this, &dxt_hc::create_alpha_selector_codebook_task, t, &selector_details[t]);
  }
  m_pTask_pool->join();

  for (uint t = 1; t < num_tasks; t++) {
    for (uint i = 0; i < m_alpha_selectors.size(); i++) {
      for (uint8 p = 0; p < 16; p++) {
        for (uint8 s = 0; s < 8; s++)
          selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
      }
      selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
    }
  }

  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    m_alpha_selectors_used[i] = selector_details[0][i].used;
    uint (&errors)[16][8] = selector_details[0][i].error;
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, p = 0; p < 16; p++, sh += 3) {
      uint* e = errors[p];
      uint8 s07 = e[7] < e[0] ? 7 : 0;
      uint8 s12 = e[2] < e[1] ? 2 : 1;
      uint8 s34 = e[4] < e[3] ? 4 : 3;
      uint8 s56 = e[6] < e[5] ? 6 : 5;
      uint8 s02 = e[s12] < e[s07] ? s12 : s07;
      uint8 s36 = e[s56] < e[s34] ? s56 : s34;
      m_alpha_selectors[i] |= (uint64)(e[s36] < e[s02] ? s36 : s02) << sh;
    }
  }
}